

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O0

int mainloop(int argc,char **argv,oonf_appdata *appdata)

{
  _Bool _Var1;
  int iVar2;
  int local_64;
  int exit_code;
  oonf_appdata *appdata_local;
  char **argv_local;
  int argc_local;
  
  local_64 = 0;
  if ((log_global_mask[1] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_MAIN,"src/libcore/oonf_main.c",0x192,(void *)0x0,0,"Starting %s",
             appdata->app_name);
  }
  do {
    do {
      _Var1 = oonf_cfg_is_running();
      if (!_Var1) goto LAB_0014bff0;
      iVar2 = (*_handle_scheduling)();
      if (iVar2 != 0) {
        local_64 = 1;
        goto LAB_0014bff0;
      }
      _Var1 = oonf_cfg_is_reload_set();
      if (_Var1) {
        if ((log_global_mask[1] & 2) != 0) {
          oonf_log(LOG_SEVERITY_INFO,LOG_MAIN,"src/libcore/oonf_main.c",0x19e,(void *)0x0,0,
                   "Reloading configuration");
        }
        iVar2 = oonf_cfg_clear_rawdb();
        if ((iVar2 != 0) ||
           ((iVar2 = parse_commandline(argc,argv,appdata,true), iVar2 == -1 &&
            (iVar2 = oonf_cfg_apply(), iVar2 != 0)))) goto LAB_0014bff0;
      }
      _Var1 = oonf_cfg_is_commit_set();
    } while (!_Var1);
    if ((log_global_mask[1] & 2) != 0) {
      oonf_log(LOG_SEVERITY_INFO,LOG_MAIN,"src/libcore/oonf_main.c",0x1ab,(void *)0x0,0,
               "Commiting configuration");
    }
    iVar2 = oonf_cfg_apply();
  } while (iVar2 == 0);
LAB_0014bff0:
  if ((log_global_mask[1] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_MAIN,"src/libcore/oonf_main.c",0x1b2,(void *)0x0,0,"Ending %s",
             appdata->app_name);
  }
  return local_64;
}

Assistant:

static int
mainloop(int argc, char **argv, const struct oonf_appdata *appdata) {
  int exit_code = 0;

  OONF_INFO(LOG_MAIN, "Starting %s", appdata->app_name);

  /* enter main loop */
  while (oonf_cfg_is_running()) {
    /* call event scheduler */
    if (_handle_scheduling()) {
      exit_code = 1;
      break;
    }

    /* reload configuration if triggered */
    if (oonf_cfg_is_reload_set()) {
      OONF_INFO(LOG_MAIN, "Reloading configuration");
      if (oonf_cfg_clear_rawdb()) {
        break;
      }
      if (parse_commandline(argc, argv, appdata, true) == -1) {
        if (oonf_cfg_apply()) {
          break;
        }
      }
    }

    /* commit config if triggered */
    if (oonf_cfg_is_commit_set()) {
      OONF_INFO(LOG_MAIN, "Commiting configuration");
      if (oonf_cfg_apply()) {
        break;
      }
    }
  }

  OONF_INFO(LOG_MAIN, "Ending %s", appdata->app_name);
  return exit_code;
}